

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

uint32 __thiscall
Js::RecyclableArgumentsArrayWalker::GetChildrenCount(RecyclableArgumentsArrayWalker *this)

{
  DynamicObject *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  ArenaAllocator *pAVar6;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar7;
  ArrayObject *pAVar8;
  uint32 index;
  uint uVar9;
  undefined8 local_40;
  Var itemObj;
  DebuggerPropertyDisplayInfo *info;
  
  pLVar7 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
  if (pLVar7 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)0x0) {
    bVar2 = VarIs<Js::ArgumentsObject>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1a,"(Js::VarIs<Js::ArgumentsObject>(instance))",
                                  "Js::VarIs<Js::ArgumentsObject>(instance)");
      if (!bVar2) goto LAB_007ee9e6;
      *puVar5 = 0;
    }
    this_00 = (DynamicObject *)
              (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance;
    pAVar6 = GetArenaFromContext((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                                 scriptContext);
    pLVar7 = JsUtil::
             List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::New(pAVar6,4);
    (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList = pLVar7;
    if (pLVar7 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xc1e,"(pMembersList)","pMembersList");
      if (!bVar2) {
LAB_007ee9e6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar3 = (*(this_00->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x6b])(this_00);
    pAVar8 = DynamicObject::GetObjectArray(this_00);
    if ((pAVar8 != (ArrayObject *)0x0) && (uVar3 < pAVar8->length)) {
      uVar3 = pAVar8->length;
    }
    for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
      iVar4 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x26])
                        (this_00,this_00,(ulong)uVar9,&local_40,
                         (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.
                         scriptContext);
      if (iVar4 == 1) {
        pAVar6 = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                     super_RecyclableObjectWalker.scriptContext);
        itemObj = new<Memory::ArenaAllocator>(0x18,pAVar6,0x35916e);
        *(uint *)itemObj = uVar9;
        *(undefined8 *)((long)itemObj + 8) = local_40;
        *(uint *)((long)itemObj + 0x10) = 0;
        JsUtil::
        List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList,
              (DebuggerPropertyDisplayInfo **)&itemObj);
      }
    }
    pLVar7 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.pMembersList;
    if (pLVar7 == (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      return 0;
    }
  }
  return (pLVar7->
         super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
         ).count;
}

Assistant:

uint32 RecyclableArgumentsArrayWalker::GetChildrenCount()
    {
        if (pMembersList == nullptr)
        {
            Assert(Js::VarIs<Js::ArgumentsObject>(instance));
            Js::ArgumentsObject * argObj = static_cast<Js::ArgumentsObject*>(instance);

            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pMembersList);

            uint32 totalCount = argObj->GetNumberOfArguments();
            Js::ArrayObject * objectArray = argObj->GetObjectArray();
            if (objectArray != nullptr && objectArray->GetLength() > totalCount)
            {
                totalCount = objectArray->GetLength();
            }

            for (uint32 index = 0; index < totalCount; index++)
            {
                Var itemObj;
                if (argObj->GetItem(argObj, index, &itemObj, scriptContext))
                {
                    DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, index, itemObj, DebuggerPropertyDisplayInfoFlags_None);
                    Assert(info);
                    pMembersList->Add(info);
                }
            }
       }

        return pMembersList ? pMembersList->Count() : 0;
    }